

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

float __thiscall asmjit::Logger::logf(Logger *this,float __x)

{
  uint uVar1;
  char in_AL;
  uint uVar2;
  char *in_RSI;
  float extraout_XMM0_Da;
  va_list ap;
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [48];
  float local_498;
  char local_418 [1032];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = __x;
  }
  local_4e0 = &ap[0].overflow_arg_area;
  local_4e8 = 0x3000000010;
  uVar2 = vsnprintf(local_418,0x400,in_RSI,&local_4e8);
  uVar1 = 0x3ff;
  if (uVar2 < 0x3ff) {
    uVar1 = uVar2;
  }
  (*this->_vptr_Logger[2])(this,local_418,(ulong)uVar1);
  return extraout_XMM0_Da;
}

Assistant:

Error Logger::logf(const char* fmt, ...) noexcept {
  Error err;

  va_list ap;
  va_start(ap, fmt);
  err = logv(fmt, ap);
  va_end(ap);

  return err;
}